

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

TidyMessageImpl *
formatStandard(TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,__va_list_tag *args)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  TidyMessageImpl *pTVar5;
  ctmbstr ptVar6;
  tmbstr local_490;
  tmbstr local_468;
  tmbstr local_448;
  tmbstr local_428;
  tmbstr local_400;
  uint *local_3b8;
  uint *local_3a0;
  undefined8 *local_388;
  undefined8 *local_370;
  undefined8 *local_358;
  undefined8 *local_340;
  undefined8 *local_328;
  long *local_310;
  long *local_2f8;
  long *local_2e0;
  long *local_2c8;
  Node *local_2a0;
  uint c2;
  uint c1;
  ctmbstr s3;
  ctmbstr s2_1;
  ctmbstr s1_1;
  ctmbstr s2;
  ctmbstr s1;
  ctmbstr str_1;
  ctmbstr name;
  ctmbstr entityname;
  ctmbstr str;
  ctmbstr tagtype;
  Node *rpt;
  char elemdesc [256];
  char nodedesc [256];
  __va_list_tag *args_local;
  uint level_local;
  uint code_local;
  Node *node_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  memset(elemdesc + 0xf8,0,0x100);
  memset(&rpt,0,0x100);
  local_2a0 = node;
  if (element != (Node *)0x0) {
    local_2a0 = element;
  }
  TagToString(node,elemdesc + 0xf8,0x100);
  if (element != (Node *)0x0) {
    TagToString(element,(char *)&rpt,0x100);
  }
  switch(code) {
  case 0x222:
  case 0x22d:
  case 0x264:
  case 0x270:
  case 0x271:
  case 0x28b:
  case 0x28c:
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,local_2a0,code,level,elemdesc + 0xf8);
    break;
  default:
    goto switchD_001672e5_caseD_223;
  case 0x225:
  case 0x25f:
  case 0x260:
  case 0x282:
  case 0x28d:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_2e0 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_2e0 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = local_2e0 + 1;
    }
    name = (ctmbstr)*local_2e0;
    if (name == (ctmbstr)0x0) {
      name = "NULL";
    }
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithLexer(doc,code,level,name);
    break;
  case 0x22c:
  case 0x233:
  case 0x236:
  case 0x237:
  case 0x24f:
  case 0x250:
  case 0x251:
  case 0x252:
  case 0x253:
  case 600:
  case 0x262:
  case 0x265:
  case 0x27d:
  case 0x291:
  case 0x293:
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,local_2a0,code,level);
    break;
  case 0x22e:
  case 0x22f:
  case 0x230:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_3a0 = (uint *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_3a0 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = local_3a0 + 2;
    }
    uVar1 = *local_3a0;
    uVar2 = args->gp_offset;
    if (uVar2 < 0x29) {
      local_3b8 = (uint *)((long)(int)uVar2 + (long)args->reg_save_area);
      args->gp_offset = uVar2 + 8;
    }
    else {
      local_3b8 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = local_3b8 + 2;
    }
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithLexer(doc,code,level,(ulong)uVar1,(ulong)*local_3b8);
    break;
  case 0x231:
  case 0x267:
  case 0x28e:
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,node,code,level,elemdesc + 0xf8)
    ;
    break;
  case 0x232:
  case 0x268:
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode
                          (doc,local_2a0,code,level,node->element,node->element);
    break;
  case 0x234:
    switch((doc->config).value[0x56].v) {
    case 1:
      str = tidyLocalizedString(0x201);
      break;
    case 2:
      str = tidyLocalizedString(0x202);
      break;
    case 3:
      str = tidyLocalizedString(0x203);
      break;
    case 4:
    default:
      str = tidyLocalizedString(0x204);
    }
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,element,code,level,&rpt,str);
    break;
  case 0x238:
  case 0x241:
  case 0x243:
  case 0x263:
  case 0x281:
  case 0x284:
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,local_2a0,code,level,&rpt);
    break;
  case 0x239:
  case 0x23a:
    ptVar6 = HTMLVersion(doc);
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,node,code,level,elemdesc + 0xf8,ptVar6);
    break;
  case 0x23d:
  case 0x23e:
  case 0x23f:
  case 0x276:
  case 0x278:
  case 0x279:
  case 0x27a:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_2c8 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_2c8 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = local_2c8 + 1;
    }
    if (*local_2c8 != 0) {
      pTVar5 = prvTidytidyMessageCreate(doc,code,level,*local_2c8);
      return pTVar5;
    }
    goto switchD_001672e5_caseD_223;
  case 0x247:
  case 0x261:
  case 0x280:
  case 0x285:
  case 0x287:
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,node,code,level,node->element);
    break;
  case 599:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_2f8 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_2f8 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = local_2f8 + 1;
    }
    if (*local_2f8 != 0) {
      pTVar5 = prvTidytidyMessageCreateWithNode(doc,node,code,level,elemdesc + 0xf8,*local_2f8);
      return pTVar5;
    }
    goto switchD_001672e5_caseD_223;
  case 0x259:
    if (element == (Node *)0x0) {
      local_468 = (tmbstr)0x0;
    }
    else {
      local_468 = element->element;
    }
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,local_2a0,code,level,local_468,elemdesc + 0xf8)
    ;
    break;
  case 0x25a:
  case 0x25b:
  case 0x26d:
    if (element == (Node *)0x0) {
      local_448 = (tmbstr)0x0;
    }
    else {
      local_448 = element->element;
    }
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,local_2a0,code,level,local_448);
    break;
  case 0x269:
  case 0x273:
  case 0x274:
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,local_2a0,code,level,&rpt,elemdesc + 0xf8);
    break;
  case 0x26a:
  case 0x27c:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_310 = (long *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_310 = (long *)args->overflow_arg_area;
      args->overflow_arg_area = local_310 + 1;
    }
    if (*local_310 != 0) {
      pTVar5 = prvTidytidyMessageCreateWithLexer(doc,code,level,*local_310);
      return pTVar5;
    }
switchD_001672e5_caseD_223:
    doc_local = (TidyDocImpl *)0x0;
    break;
  case 0x26b:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_358 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_358 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_358 + 1;
    }
    uVar3 = *local_358;
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_370 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_370 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_370 + 1;
    }
    uVar4 = *local_370;
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_388 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_388 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_388 + 1;
    }
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithLexer(doc,code,level,uVar3,uVar4,*local_388);
    break;
  case 0x26c:
  case 0x277:
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_328 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_328 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_328 + 1;
    }
    uVar3 = *local_328;
    uVar1 = args->gp_offset;
    if (uVar1 < 0x29) {
      local_340 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      local_340 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = local_340 + 1;
    }
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithLexer(doc,code,level,uVar3,*local_340);
    break;
  case 0x275:
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,node,code,level);
    break;
  case 0x27b:
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreate(doc,code,level);
    break;
  case 0x27e:
    if (element == (Node *)0x0) {
      local_400 = (tmbstr)0x0;
    }
    else {
      local_400 = element->element;
    }
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,node,code,level,elemdesc + 0xf8,local_400);
    break;
  case 0x27f:
    if (element == (Node *)0x0) {
      local_490 = (tmbstr)0x0;
    }
    else {
      local_490 = element->element;
    }
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,local_2a0,code,level,node->element,local_490);
    break;
  case 0x286:
    if (element == (Node *)0x0) {
      local_428 = (tmbstr)0x0;
    }
    else {
      local_428 = element->element;
    }
    doc_local = (TidyDocImpl *)
                prvTidytidyMessageCreateWithNode(doc,node,code,level,node->element,local_428);
  }
  return (TidyMessageImpl *)doc_local;
}

Assistant:

TidyMessageImpl *formatStandard(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    char nodedesc[ 256 ] = {0};
    char elemdesc[ 256 ] = {0};
    Node* rpt = ( element ? element : node );

    TagToString(node, nodedesc, sizeof(nodedesc));

    if ( element )
        TagToString(element, elemdesc, sizeof(elemdesc));

    switch ( code )
    {
        case CUSTOM_TAG_DETECTED:
        {
            ctmbstr tagtype;
            switch ( cfg( doc, TidyUseCustomTags ) )
            {
                case TidyCustomBlocklevel:
                    tagtype = tidyLocalizedString( TIDYCUSTOMBLOCKLEVEL_STRING );
                    break;
                case TidyCustomEmpty:
                    tagtype = tidyLocalizedString( TIDYCUSTOMEMPTY_STRING );
                    break;
                case TidyCustomInline:
                    tagtype = tidyLocalizedString( TIDYCUSTOMINLINE_STRING );
                    break;
                case TidyCustomPre:
                default:
                    tagtype = tidyLocalizedString( TIDYCUSTOMPRE_STRING );
                    break;
            }
            return TY_(tidyMessageCreateWithNode)(doc, element, code, level, elemdesc, tagtype );
        }

        case STRING_NO_SYSID:
            return TY_(tidyMessageCreate)( doc, code, level );
            
        case FILE_CANT_OPEN:
        case FILE_CANT_OPEN_CFG:
        case FILE_NOT_FILE:
        case STRING_CONTENT_LOOKS:
        case STRING_DOCTYPE_GIVEN:
        case STRING_MISSING_MALFORMED:
        case STRING_MUTING_TYPE:
        {
            ctmbstr str;
            if ( (str = va_arg( args, ctmbstr)) )
                return TY_(tidyMessageCreate)( doc, code, level, str );

        } break;

        case APOS_UNDEFINED:
        case MISSING_SEMICOLON_NCR:
        case MISSING_SEMICOLON:
        case UNESCAPED_AMPERSAND:
        case UNKNOWN_ENTITY:
        {
            ctmbstr entityname;
            if ( !(entityname = va_arg( args, ctmbstr)) )
            {
                entityname = "NULL";
            }
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, entityname);
        }

        case MISSING_ATTRIBUTE:
        {
            ctmbstr name;
            if ( (name = va_arg( args, ctmbstr)) )
                return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc, name );
        } break;

        case STRING_UNKNOWN_OPTION:
        case OPTION_REMOVED:
        {
            ctmbstr str;
            if ( (str = va_arg( args, ctmbstr)) )
                return TY_(tidyMessageCreateWithLexer)(doc, code, level, str);
        } break;

        case OPTION_REMOVED_UNAPPLIED:
        case STRING_ARGUMENT_BAD:
        {
            ctmbstr s1 = va_arg( args, ctmbstr );
            ctmbstr s2 = va_arg( args, ctmbstr );
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, s1, s2);
        }

        case OPTION_REMOVED_APPLIED:
        {
            ctmbstr s1 = va_arg( args, ctmbstr );
            ctmbstr s2 = va_arg( args, ctmbstr );
            ctmbstr s3 = va_arg( args, ctmbstr );
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, s1, s2, s3);
        }


        case BAD_SURROGATE_LEAD:
        case BAD_SURROGATE_PAIR:
        case BAD_SURROGATE_TAIL:
        {
            uint c1 = va_arg( args, uint );
            uint c2 = va_arg( args, uint );
            return TY_(tidyMessageCreateWithLexer)(doc, code, level, c1, c2);
        }

        case SPACE_PRECEDING_XMLDECL:
            /* @TODO: Should this be a TidyInfo "silent" fix? */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level );

        case CANT_BE_NESTED:
        case NOFRAMES_CONTENT:
        case USING_BR_INPLACE_OF:
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc );

        case ELEMENT_VERS_MISMATCH_ERROR:
        case ELEMENT_VERS_MISMATCH_WARN:
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc, HTMLVersion(doc) );

        case TAG_NOT_ALLOWED_IN:
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, nodedesc, element ? element->element : NULL );

        case INSERTING_TAG:
        case MISSING_STARTTAG:
        case TOO_MANY_ELEMENTS:
        case UNEXPECTED_ENDTAG:
        case UNEXPECTED_ENDTAG_ERR:  /* generated by XML docs */
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, node->element );

        case UNEXPECTED_ENDTAG_IN:
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, level, node->element, element ? element->element : NULL );

        case BAD_CDATA_CONTENT:
        case CONTENT_AFTER_BODY:
        case DOCTYPE_AFTER_TAGS:
        case DUPLICATE_FRAMESET:
        case MALFORMED_COMMENT:
        case MALFORMED_COMMENT_DROPPING:
        case MALFORMED_COMMENT_EOS:
        case MALFORMED_COMMENT_WARN:
        case MALFORMED_DOCTYPE:
        case MISSING_DOCTYPE:
        case MISSING_TITLE_ELEMENT:
        case NESTED_QUOTATION:
        case SUSPECTED_MISSING_QUOTE:
        case XML_DECLARATION_DETECTED:
        case BLANK_TITLE_ELEMENT:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level );

        case ELEMENT_NOT_EMPTY:
        case FOUND_STYLE_IN_BODY:
        case ILLEGAL_NESTING:
        case MOVED_STYLE_TO_HEAD:
        case TRIM_EMPTY_ELEMENT:
        case UNEXPECTED_END_OF_FILE:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, elemdesc );

        case OBSOLETE_ELEMENT:
        case REPLACING_ELEMENT:
        case REPLACING_UNEX_ELEMENT:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, elemdesc, nodedesc );

        case ADDED_MISSING_CHARSET:
        case BAD_SUMMARY_HTML5:
        case NESTED_EMPHASIS:
        case PROPRIETARY_ELEMENT:
        case REMOVED_HTML5:
        case UNKNOWN_ELEMENT:
        case UNKNOWN_ELEMENT_LOOKS_CUSTOM:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, nodedesc );

        case MISSING_ENDTAG_FOR:
        case MISSING_ENDTAG_OPTIONAL:
        case PREVIOUS_LOCATION:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, element? element->element : NULL );

        case MISSING_ENDTAG_BEFORE:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, element? element->element : NULL, nodedesc );

        case COERCE_TO_ENDTAG:
        case NON_MATCHING_ENDTAG:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, node->element, node->element );
        case TOO_MANY_ELEMENTS_IN:
            return TY_(tidyMessageCreateWithNode)(doc, rpt, code, level, node->element, element ? element->element : NULL);

    }

    return NULL;
}